

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O1

void __thiscall
TreeNode<ObservationHistory>::SetSuccessor
          (TreeNode<ObservationHistory> *this,LIndex sucI,TreeNode<ObservationHistory> *suc)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppTVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>,_bool>
  pVar7;
  pair<unsigned_long_long,_TreeNode<ObservationHistory>_*> arg_pair;
  stringstream ss;
  LIndex local_1b0;
  pair<unsigned_long_long,_TreeNode<ObservationHistory>_*> local_1a8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  p_Var1 = &(this->_m_successor)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < sucI]) {
    if (*(ulong *)(p_Var6 + 1) >= sucI) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, sucI < *(ulong *)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  local_1b0 = sucI;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    local_1a8.first = sucI;
    local_1a8.second = suc;
    pVar7 = std::
            _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>,std::_Select1st<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>>
            ::_M_emplace_unique<std::pair<unsigned_long_long,TreeNode<ObservationHistory>*>&>
                      ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>,std::_Select1st<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<ObservationHistory>*>>>
                        *)&this->_m_successor,&local_1a8);
    if (pVar7.second == false) {
      std::__cxx11::stringstream::stringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_188,"TreeNode<Tcontained>::SetSuccessor insertion failed, ",0x35);
      std::__ostream_insert<char,std::char_traits<char>>(local_188,"but _m_successor[",0x11);
      poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_188);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] wasn\'t already set ?!?",0x18);
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar4 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      __cxa_throw(puVar4,&E::typeinfo,E::~E);
    }
  }
  else {
    ppTVar2 = std::
              map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
              ::operator[](&this->_m_successor,&local_1b0);
    *ppTVar2 = suc;
  }
  suc->_m_pred = this;
  return;
}

Assistant:

void TreeNode<Tcontained>::SetSuccessor(LIndex sucI, 
    TreeNode<Tcontained>* suc)
{
    if( ExistsSuccessor(sucI) )
    {
#if DEBUG_TREENODE
        cout << "_m_successor["<< sucI<< "] already set: overwriting!\n";
#endif
        _m_successor[sucI] = suc;
    }
    else
    {    
        std::pair< LIndex, TreeNode<Tcontained>* > arg_pair = 
            std::make_pair(sucI, suc);
        std::pair< typename std::map< LIndex, TreeNode<Tcontained>* >::iterator, bool> 
            result_pair;
        result_pair = _m_successor.insert(arg_pair);
        if(result_pair.second == false)
        {
            std::stringstream ss;
            ss << "TreeNode<Tcontained>::SetSuccessor insertion failed, "
               << "but _m_successor["<< sucI<< "] wasn't already set ?!?";
            throw(E(ss));
        }
    }

    suc->SetPredeccessor(this);
}